

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setup(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  bool bVar1;
  type_conflict5 tVar2;
  cpp_dec_float<50U,_int,_void> *this_00;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int i;
  int d;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe74;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe78;
  undefined1 local_11c [112];
  undefined4 local_ac;
  undefined1 local_a8 [56];
  int local_70;
  int local_6c;
  undefined8 local_60;
  undefined4 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  reference local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  reference local_18;
  undefined1 *local_10;
  undefined4 *local_8;
  
  bVar1 = isSetup(in_RDI);
  if (!bVar1) {
    IdxSet::clear(&in_RDI->super_IdxSet);
    local_6c = dim((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x36b0cd);
    (in_RDI->super_IdxSet).num = 0;
    for (local_70 = 0; local_70 < local_6c; local_70 = local_70 + 1) {
      this_00 = &std::
                 vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ::operator[](&(in_RDI->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val,(long)local_70)->m_backend;
      local_ac = 0;
      local_50 = local_a8;
      local_58 = &local_ac;
      local_60 = 0;
      local_8 = local_58;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),(longlong)in_RDI,
                 this_00);
      bVar1 = boost::multiprecision::operator!=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffe58,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x36b191);
      if (bVar1) {
        local_30 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[](&(in_RDI->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val,(long)local_70);
        local_28 = local_11c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (this_00,in_stack_fffffffffffffe58);
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_fffffffffffffe58);
        getEpsilon(in_stack_fffffffffffffe78);
        tVar2 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffffe58,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x36b213);
        if (tVar2) {
          in_stack_fffffffffffffe70 = 0;
          local_38 = &stack0xfffffffffffffe74;
          local_40 = &stack0xfffffffffffffe70;
          local_48 = 0;
          local_10 = local_40;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)((ulong)in_stack_fffffffffffffe74 << 0x20),
                     (longlong)in_RDI,this_00);
          local_18 = std::
                     vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ::operator[](&(in_RDI->
                                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).val,(long)local_70);
          local_20 = &stack0xfffffffffffffe74;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (this_00,in_stack_fffffffffffffe58);
        }
        else {
          (in_RDI->super_IdxSet).idx[(in_RDI->super_IdxSet).num] = local_70;
          (in_RDI->super_IdxSet).num = (in_RDI->super_IdxSet).num + 1;
        }
      }
    }
    in_RDI->setupStatus = true;
  }
  return;
}

Assistant:

void setup()
   {
      if(!isSetup())
      {
         IdxSet::clear();

         int d = dim();
         num = 0;

         for(int i = 0; i < d; ++i)
         {
            if(VectorBase<R>::val[i] != R(0))
            {
               if(spxAbs(VectorBase<R>::val[i]) <= this->getEpsilon())
                  VectorBase<R>::val[i] = R(0);
               else
               {
                  idx[num] = i;
                  num++;
               }
            }
         }

         setupStatus = true;

         assert(isConsistent());
      }
   }